

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEditBox.cpp
# Opt level: O0

s32 __thiscall irr::gui::CGUIEditBox::getLineFromPos(CGUIEditBox *this,s32 pos)

{
  u32 uVar1;
  u32 uVar2;
  int *piVar3;
  int in_ESI;
  array<int> *in_RDI;
  s32 i;
  u32 local_18;
  int local_4;
  
  if (((in_RDI[0xc].is_sorted & 1U) == 0) && ((in_RDI[0xc].field_0x19 & 1) == 0)) {
    local_4 = 0;
  }
  else {
    local_18 = 0;
    while (uVar2 = local_18, uVar1 = core::array<int>::size((array<int> *)0x3a87c9),
          (int)uVar2 < (int)uVar1) {
      piVar3 = core::array<int>::operator[](in_RDI,uVar2);
      if (in_ESI < *piVar3) {
        return local_18 - 1;
      }
      local_18 = local_18 + 1;
    }
    uVar2 = core::array<int>::size((array<int> *)0x3a881b);
    local_4 = uVar2 - 1;
  }
  return local_4;
}

Assistant:

s32 CGUIEditBox::getLineFromPos(s32 pos)
{
	if (!WordWrap && !MultiLine)
		return 0;

	s32 i = 0;
	while (i < (s32)BrokenTextPositions.size()) {
		if (BrokenTextPositions[i] > pos)
			return i - 1;
		++i;
	}
	return (s32)BrokenTextPositions.size() - 1;
}